

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.h
# Opt level: O2

Dec_Graph_t * Dec_GraphCreateConst0(void)

{
  Dec_Graph_t *pDVar1;
  
  pDVar1 = (Dec_Graph_t *)calloc(1,0x20);
  pDVar1->fConst = 1;
  pDVar1->eRoot = (Dec_Edge_t)0x1;
  return pDVar1;
}

Assistant:

static inline Dec_Graph_t * Dec_GraphCreateConst0()   
{
    Dec_Graph_t * pGraph;
    pGraph = ABC_ALLOC( Dec_Graph_t, 1 );
    memset( pGraph, 0, sizeof(Dec_Graph_t) );
    pGraph->fConst = 1;
    pGraph->eRoot.fCompl = 1;
    return pGraph;
}